

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * AnalyzePreModify(ExpressionContext *ctx,SynPreModify *syntax)

{
  VariableData *pVVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ExprGetAddress *pEVar6;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  ExprGetAddress *pEVar7;
  ExprBase *pEVar8;
  TypeBase *pTVar9;
  undefined4 extraout_var_02;
  TypeBase *pTVar10;
  ExprError *pEVar11;
  undefined1 uVar12;
  char *pcVar13;
  ExprGetAddress *pEVar14;
  VariableHandle *variable;
  undefined4 extraout_var_01;
  
  pEVar6 = (ExprGetAddress *)AnalyzeExpression(ctx,syntax->value);
  pTVar10 = (pEVar6->super_ExprBase).type;
  if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0)) {
    if ((pEVar6 == (ExprGetAddress *)0x0) ||
       (pEVar7 = pEVar6, (pEVar6->super_ExprBase).typeID != 0x22)) {
      pEVar7 = (ExprGetAddress *)0x0;
    }
    if (pEVar7 == (ExprGetAddress *)0x0) {
      if ((pEVar6 == (ExprGetAddress *)0x0) ||
         (pEVar7 = pEVar6, (pEVar6->super_ExprBase).typeID != 0x16)) {
        pEVar7 = (ExprGetAddress *)0x0;
      }
      pEVar14 = pEVar6;
      if (pEVar7 != (ExprGetAddress *)0x0) {
        pEVar14 = (ExprGetAddress *)pEVar7->variable;
      }
    }
    else {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      type = ExpressionContext::GetReferenceType(ctx,(pEVar6->super_ExprBase).type);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_00,iVar5);
      pVVar1 = (VariableData *)pEVar7->variable;
      variable->source = (pEVar7->super_ExprBase).source;
      variable->variable = pVVar1;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var,iVar4),&syntax->super_SynBase,
                 &type->super_TypeBase,variable);
      pEVar14 = (ExprGetAddress *)CONCAT44(extraout_var,iVar4);
    }
    pTVar10 = (pEVar14->super_ExprBase).type;
    if ((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0x12)) {
      pTVar9 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pTVar10 = (pEVar6->super_ExprBase).type;
      pEVar11 = anon_unknown.dwarf_9fd58::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar9,
                           "ERROR: cannot change immutable value of type %.*s",
                           (ulong)(uint)(*(int *)&(pTVar10->name).end - (int)(pTVar10->name).begin))
      ;
      return &pEVar11->super_ExprBase;
    }
    bVar3 = ExpressionContext::IsNumericType(ctx,(pEVar6->super_ExprBase).type);
    if (!bVar3) {
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pcVar13 = "decrement";
      if (syntax->isIncrement != false) {
        pcVar13 = "increment";
      }
      pTVar9 = (pEVar6->super_ExprBase).type;
      pcVar2 = (pTVar9->name).begin;
      pEVar11 = anon_unknown.dwarf_9fd58::ReportExpected
                          (ctx,&syntax->super_SynBase,pTVar10,
                           "ERROR: %s is not supported on \'%.*s\'",pcVar13,
                           (ulong)(uint)(*(int *)&(pTVar9->name).end - (int)pcVar2),pcVar2);
      return &pEVar11->super_ExprBase;
    }
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    pTVar10 = (pEVar6->super_ExprBase).type;
    uVar12 = syntax->isIncrement;
    pEVar8->typeID = 0x10;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229cc0;
    pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar14;
  }
  else {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    uVar12 = syntax->isIncrement;
    pEVar8->typeID = 0x10;
    pEVar8->source = &syntax->super_SynBase;
    pEVar8->type = pTVar10;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229cc0;
    pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar6;
  }
  *(undefined1 *)&pEVar8[1].typeID = uVar12;
  return pEVar8;
}

Assistant:

ExprBase* AnalyzePreModify(ExpressionContext &ctx, SynPreModify *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, ctx.GetErrorType(), value, syntax->isIncrement);

	ExprBase* wrapped = value;

	if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(syntax, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	else if(ExprDereference *node = getType<ExprDereference>(value))
		wrapped = node->value;

	if(!isType<TypeRef>(wrapped->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot change immutable value of type %.*s", FMT_ISTR(value->type->name));

	if(!ctx.IsNumericType(value->type))
		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: %s is not supported on '%.*s'", (syntax->isIncrement ? "increment" : "decrement"), FMT_ISTR(value->type->name));

	return new (ctx.get<ExprPreModify>()) ExprPreModify(syntax, value->type, wrapped, syntax->isIncrement);
}